

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cc
# Opt level: O2

void __thiscall
flow::lang::HandlerSym::implement
          (HandlerSym *this,
          unique_ptr<flow::lang::SymbolTable,_std::default_delete<flow::lang::SymbolTable>_> *table,
          unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *body)

{
  std::__uniq_ptr_impl<flow::lang::SymbolTable,_std::default_delete<flow::lang::SymbolTable>_>::
  operator=((__uniq_ptr_impl<flow::lang::SymbolTable,_std::default_delete<flow::lang::SymbolTable>_>
             *)&this->scope_,
            (__uniq_ptr_impl<flow::lang::SymbolTable,_std::default_delete<flow::lang::SymbolTable>_>
             *)table);
  std::__uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>::operator=
            ((__uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *)
             &this->body_,
             (__uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *)body);
  return;
}

Assistant:

void HandlerSym::implement(std::unique_ptr<SymbolTable>&& table,
                           std::unique_ptr<Stmt>&& body) {
  scope_ = std::move(table);
  body_ = std::move(body);
}